

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseTrianglesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  bool bVar1;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  while ((bVar1 = SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local)
         , bVar1 && (bVar1 = TokenMatch<char_const>((char **)&szCurrentOut_local,"end",3), !bVar1)))
  {
    ParseTriangle(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
  }
  SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
  *szCurrentOut = (char *)szCurrentOut_local;
  return;
}

Assistant:

void SMDImporter::ParseTrianglesSection(const char* szCurrent, const char** szCurrentOut) {
    // Parse a triangle, parse another triangle, parse the next triangle ...
    // and so on until we reach a token that looks quite similar to "end"
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the triangles section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }
        ParseTriangle(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}